

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void composition_clear(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint32_t uVar1;
  int local_2c;
  int i;
  uint32_t ialpha;
  uint32_t const_alpha_local;
  uint32_t *src_local;
  int length_local;
  uint32_t *dest_local;
  
  if (const_alpha == 0xff) {
    plutovg_memfill32(dest,length,0);
  }
  else {
    for (local_2c = 0; local_2c < length; local_2c = local_2c + 1) {
      uVar1 = BYTE_MUL(dest[local_2c],0xff - const_alpha);
      dest[local_2c] = uVar1;
    }
  }
  return;
}

Assistant:

static void composition_clear(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        plutovg_memfill32(dest, length, 0);
    } else {
        uint32_t ialpha = 255 - const_alpha;
        for(int i = 0; i < length; i++) {
            dest[i] = BYTE_MUL(dest[i], ialpha);
        }
    }
}